

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O2

uint8 * __thiscall
google::protobuf::SourceCodeInfo::InternalSerializeWithCachedSizesToArray
          (SourceCodeInfo *this,bool deterministic,uint8 *target)

{
  int iVar1;
  Type *value;
  UnknownFieldSet *unknown_fields;
  uint8 *puVar2;
  int index;
  
  iVar1 = (this->location_).super_RepeatedPtrFieldBase.current_size_;
  for (index = 0; iVar1 != index; index = index + 1) {
    value = internal::RepeatedPtrFieldBase::
            Get<google::protobuf::RepeatedPtrField<google::protobuf::SourceCodeInfo_Location>::TypeHandler>
                      (&(this->location_).super_RepeatedPtrFieldBase,index);
    target = internal::WireFormatLite::
             InternalWriteMessageNoVirtualToArray<google::protobuf::SourceCodeInfo_Location>
                       (1,value,deterministic,target);
  }
  if (((ulong)(this->_internal_metadata_).
              super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
              .ptr_ & 1) == 0) {
    return target;
  }
  unknown_fields = SourceCodeInfo::unknown_fields(this);
  puVar2 = internal::WireFormat::SerializeUnknownFieldsToArray(unknown_fields,target);
  return puVar2;
}

Assistant:

::google::protobuf::uint8* SourceCodeInfo::InternalSerializeWithCachedSizesToArray(
    bool deterministic, ::google::protobuf::uint8* target) const {
  // @@protoc_insertion_point(serialize_to_array_start:google.protobuf.SourceCodeInfo)
  ::google::protobuf::uint32 cached_has_bits = 0;
  (void) cached_has_bits;

  // repeated .google.protobuf.SourceCodeInfo.Location location = 1;
  for (unsigned int i = 0, n = this->location_size(); i < n; i++) {
    target = ::google::protobuf::internal::WireFormatLite::
      InternalWriteMessageNoVirtualToArray(
        1, this->location(i), deterministic, target);
  }

  if (_internal_metadata_.have_unknown_fields()) {
    target = ::google::protobuf::internal::WireFormat::SerializeUnknownFieldsToArray(
        unknown_fields(), target);
  }
  // @@protoc_insertion_point(serialize_to_array_end:google.protobuf.SourceCodeInfo)
  return target;
}